

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O3

void __thiscall Tokenizer::Tokenizer(Tokenizer *this,string *p)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  anon_class_1_0_00000001 local_31;
  _Variadic_union<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  local_30;
  byte local_10;
  
  this->pos = 0;
  this->line_number = 1;
  this->col_number = 0;
  (this->current_line)._M_dataplus._M_p = (pointer)&(this->current_line).field_2;
  (this->current_line)._M_string_length = 0;
  (this->current_line).field_2._M_local_buf[0] = '\0';
  (this->header_block_name)._M_dataplus._M_p = (pointer)&(this->header_block_name).field_2;
  (this->header_block_name)._M_string_length = 0;
  (this->header_block_name).field_2._M_local_buf[0] = '\0';
  paVar1 = &(this->program).field_2;
  (this->program)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (p->_M_dataplus)._M_p;
  paVar2 = &p->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&p->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->program).field_2 + 8) = uVar4;
  }
  else {
    (this->program)._M_dataplus._M_p = pcVar3;
    (this->program).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->program)._M_string_length = p->_M_string_length;
  (p->_M_dataplus)._M_p = (pointer)paVar2;
  p->_M_string_length = 0;
  (p->field_2)._M_local_buf[0] = '\0';
  local_30._M_first._M_storage = (_Uninitialized<int,_true>)0;
  local_10 = 0;
  (this->currentToken).type = Empty;
  std::__detail::__variant::
  _Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  ::_Move_ctor_base((_Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                     *)&(this->currentToken).value,
                    (_Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                     *)&local_30._M_first);
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>_&>
    ::_S_vtable._M_arr[local_10]._M_data)
            (&local_31,
             (variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
              *)&local_30);
  return;
}

Assistant:

Tokenizer::Tokenizer(string p) : program(std::move(p)), currentToken(Token(Empty, 0)), pos(0), line_number(1),
                                 col_number(0) {}